

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void * __thiscall
testing::internal::UntypedFunctionMockerBase::MockObject(UntypedFunctionMockerBase *this)

{
  void *pvVar1;
  FailureReporterInterface *pFVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  pvVar1 = this->mock_obj_;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "MockObject() must not be called before RegisterOwner() or SetOwnerAndName() has been called."
             ,"");
  if (pvVar1 == (void *)0x0) {
    pFVar2 = GetFailureReporter();
    (*pFVar2->_vptr_FailureReporterInterface[2])
              (pFVar2,1,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/3rdparty/googletest/googlemock/src/gmock-spec-builders.cc"
               ,0x15c,local_38);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  pvVar1 = this->mock_obj_;
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  return pvVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const void* mock_obj;
  {
    // We protect mock_obj_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(mock_obj_ != nullptr, __FILE__, __LINE__,
           "MockObject() must not be called before RegisterOwner() or "
           "SetOwnerAndName() has been called.");
    mock_obj = mock_obj_;
  }
  return mock_obj;
}